

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmwCmpxchg<unsigned_int,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  pointer puVar1;
  Store *this_00;
  ulong uVar2;
  RunResult RVar3;
  ulong uVar4;
  Value VVar5;
  Value VVar6;
  Value VVar7;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar5 = Pop(this);
  VVar6 = Pop(this);
  VVar7 = Pop(this);
  uVar2 = (ulong)instr.field_2.imm_u32x2.snd;
  if ((instr.field_2.imm_u32x2.snd + VVar7.i32_ & 3) == 0) {
    uVar4 = VVar7.i64_ & 0xffffffff;
    puVar1 = ((local_80.obj_)->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar4 + uVar2 + 4 <=
        (ulong)((long)((local_80.obj_)->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1)) {
      VVar7._8_8_ = puVar1 + uVar4;
      VVar7.i64_._4_4_ = 0;
      VVar7.i32_ = *(uint *)(VVar7._8_8_ + uVar2);
      if (*(uint *)(VVar7._8_8_ + uVar2) == VVar6.i32_) {
        *(u32 *)(VVar7._8_8_ + uVar2) = VVar5.i32_;
      }
      Push(this,VVar7);
      RVar3 = Ok;
      goto LAB_0015dc99;
    }
  }
  this_00 = this->store_;
  StringPrintf_abi_cxx11_(&local_68,"invalid atomic access at %u+%u",VVar7.i64_ & 0xffffffff);
  Store::
  Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
            (&local_48,this_00,this_00,&local_68,&this->frames_);
  out_trap->obj_ = local_48.obj_;
  out_trap->store_ = local_48.store_;
  out_trap->root_index_ = local_48.root_index_;
  local_48.obj_ = (Trap *)0x0;
  local_48.store_ = (Store *)0x0;
  local_48.root_index_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  RVar3 = Trap;
LAB_0015dc99:
  if (local_80.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_80.store_)->roots_,local_80.root_index_);
  }
  return RVar3;
}

Assistant:

RunResult Thread::DoAtomicRmwCmpxchg(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V replace = static_cast<V>(Pop<T>());
  V expect = static_cast<V>(Pop<T>());
  V old;
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->AtomicRmwCmpxchg(offset, instr.imm_u32x2.snd, expect,
                                          replace, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(old));
  return RunResult::Ok;
}